

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O3

void lore_update(monster_race *race,monster_lore *lore)

{
  bitflag *flags1;
  undefined8 *puVar1;
  undefined8 *puVar2;
  monster_blow *pmVar3;
  monster_blow *pmVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  angband_constants *paVar8;
  bitflag mask [11];
  bitflag local_2b [11];
  
  if (lore != (monster_lore *)0x0 && race != (monster_race *)0x0) {
    create_mon_flag_mask(local_2b,1,0xf);
    flags1 = lore->flags;
    flag_union(flags1,local_2b,0xb);
    if (z_info->mon_blows_max != 0) {
      lVar6 = 0x18;
      uVar7 = 0;
      paVar8 = z_info;
      do {
        pmVar3 = race->blow;
        if (pmVar3 == (monster_blow *)0x0) break;
        pmVar4 = lore->blows;
        if (((lore->blow_known[uVar7] != false) || (*(int *)((long)&pmVar4->effect + lVar6) != 0))
           || (lore->all_known == true)) {
          lore->blow_known[uVar7] = true;
          puVar1 = (undefined8 *)((long)pmVar3 + lVar6 + -0x10);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)pmVar4 + lVar6 + -0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          puVar1 = (undefined8 *)((long)&pmVar3->next + lVar6);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pmVar4->next + lVar6);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          paVar8 = z_info;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x30;
      } while (uVar7 < paVar8->mon_blows_max);
    }
    if ((lore->tkills != 0) || (lore->all_known == true)) {
      lore->armour_known = true;
      lore->drop_known = true;
      create_mon_flag_mask(local_2b,10,9,6,0xf);
      flag_union(flags1,local_2b,0xb);
      flag_on_dbg(flags1,0xb,0xc,"lore->flags","RF_FORCE_DEPTH");
    }
    if (((race->sleep < (int)((uint)lore->wake * (uint)lore->wake)) || (lore->ignore == 0xff)) ||
       ((lore->all_known != false || ((race->sleep == L'\0' && (9 < lore->tkills)))))) {
      lore->sleep_known = true;
    }
    if ((0x32 < lore->cast_innate) || (lore->all_known == true)) {
      lore->innate_freq_known = true;
    }
    if ((0x32 < lore->cast_spell) || ((lore->all_known & 1U) != 0)) {
      lore->spell_freq_known = true;
    }
    if ((lore->all_known & 1U) != 0) {
      flag_setall(flags1,0xb);
      flag_copy(lore->spell_flags,race->spell_flags,0xc);
    }
  }
  return;
}

Assistant:

void lore_update(const struct monster_race *race, struct monster_lore *lore)
{
	int i;
	bitflag mask[RF_SIZE];

	if (!race || !lore) return;

	/* Assume some "obvious" flags */
	create_mon_flag_mask(mask, RFT_OBV, RFT_MAX);
	rf_union(lore->flags, mask);

	/* Blows */
	for (i = 0; i < z_info->mon_blows_max; i++) {
		if (!race->blow) break;
		if (lore->blow_known[i] || lore->blows[i].times_seen ||
			lore->all_known) {
			lore->blow_known[i] = true;
			lore->blows[i].method = race->blow[i].method;
			lore->blows[i].effect = race->blow[i].effect;
			lore->blows[i].dice = race->blow[i].dice;
		}
	}

	/* Killing a monster reveals some properties */
	if ((lore->tkills > 0) || lore->all_known) {
		lore->armour_known = true;
		lore->drop_known = true;
		create_mon_flag_mask(mask, RFT_RACE_A, RFT_RACE_N, RFT_DROP, RFT_MAX);
		rf_union(lore->flags, mask);
		rf_on(lore->flags, RF_FORCE_DEPTH);
	}

	/* Awareness */
	if ((((int)lore->wake * (int)lore->wake) > race->sleep) ||
	    (lore->ignore == UCHAR_MAX) || lore->all_known ||
	    ((race->sleep == 0) && (lore->tkills >= 10)))
		lore->sleep_known = true;

	/* Spellcasting frequency */
	if (lore->cast_innate > 50 || lore->all_known) {
		lore->innate_freq_known = true;
	}
	if (lore->cast_spell > 50 || lore->all_known) {
		lore->spell_freq_known = true;
	}

	/* Flags for probing and cheating */
	if (lore->all_known) {
		rf_setall(lore->flags);
		rsf_copy(lore->spell_flags, race->spell_flags);
	}
}